

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O0

void removeExpiredTwinRequestsFromList
               (PMQTTTRANSPORT_HANDLE_DATA transport_data,tickcounter_ms_t current_ms,
               DLIST_ENTRY *twin_list)

{
  DLIST_ENTRY_TAG *pDVar1;
  bool bVar2;
  MQTT_DEVICE_TWIN_ITEM *msg_entry_00;
  _Bool item_timed_out;
  MQTT_DEVICE_TWIN_ITEM *msg_entry;
  DLIST_ENTRY next_list_item;
  PDLIST_ENTRY list_item;
  DLIST_ENTRY *twin_list_local;
  tickcounter_ms_t current_ms_local;
  PMQTTTRANSPORT_HANDLE_DATA transport_data_local;
  
  pDVar1 = twin_list->Flink;
  while (next_list_item.Blink = pDVar1, next_list_item.Blink != twin_list) {
    pDVar1 = (next_list_item.Blink)->Flink;
    msg_entry_00 = (MQTT_DEVICE_TWIN_ITEM *)(next_list_item.Blink + -3);
    bVar2 = false;
    if ((*(int *)&next_list_item.Blink[-1].Blink == 1) &&
       (0x3b < (current_ms - msg_entry_00->msgCreationTime) / 1000)) {
      bVar2 = true;
      if (next_list_item.Blink[1].Flink != (DLIST_ENTRY_TAG *)0x0) {
        (*(code *)next_list_item.Blink[1].Flink)(0,0,0,next_list_item.Blink[1].Blink);
      }
    }
    else if ((*(int *)&next_list_item.Blink[-1].Blink == 0) &&
            (299 < (current_ms - msg_entry_00->msgCreationTime) / 1000)) {
      bVar2 = true;
      (*(transport_data->transport_callbacks).twin_rpt_state_complete_cb)
                (*(uint32_t *)((long)&next_list_item.Blink[-2].Blink + 4),0x198,
                 transport_data->transport_ctx);
    }
    if (bVar2) {
      DList_RemoveEntryList(next_list_item.Blink);
      destroyDeviceTwinGetMsg(msg_entry_00);
    }
  }
  return;
}

Assistant:

static void removeExpiredTwinRequestsFromList(PMQTTTRANSPORT_HANDLE_DATA transport_data, tickcounter_ms_t current_ms, DLIST_ENTRY* twin_list)
{
    PDLIST_ENTRY list_item = twin_list->Flink;

    while (list_item != twin_list)
    {
        DLIST_ENTRY next_list_item;
        next_list_item.Flink = list_item->Flink;
        MQTT_DEVICE_TWIN_ITEM* msg_entry = containingRecord(list_item, MQTT_DEVICE_TWIN_ITEM, entry);
        bool item_timed_out = false;

        if ((msg_entry->device_twin_msg_type == RETRIEVE_PROPERTIES) &&
            (((current_ms - msg_entry->msgCreationTime) / 1000) >= ON_DEMAND_GET_TWIN_REQUEST_TIMEOUT_SECS))
        {
            item_timed_out = true;
            if (msg_entry->userCallback != NULL)
            {
                msg_entry->userCallback(DEVICE_TWIN_UPDATE_COMPLETE, NULL, 0, msg_entry->userContext);
            }
        }
        else if ((msg_entry->device_twin_msg_type == REPORTED_STATE) &&
                 (((current_ms - msg_entry->msgCreationTime) / 1000) >= TWIN_REPORT_UPDATE_TIMEOUT_SECS))
        {
            item_timed_out = true;
            transport_data->transport_callbacks.twin_rpt_state_complete_cb(msg_entry->iothub_msg_id, STATUS_CODE_TIMEOUT_VALUE, transport_data->transport_ctx);
        }

        if (item_timed_out)
        {
            (void)DList_RemoveEntryList(list_item);
            destroyDeviceTwinGetMsg(msg_entry);
        }

        list_item = next_list_item.Flink;
    }

}